

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

string * (anonymous_namespace)::bothOrAll_abi_cxx11_(size_t count)

{
  bool bVar1;
  char *pcVar2;
  long in_RSI;
  string *in_RDI;
  allocator local_11 [17];
  
  bVar1 = false;
  if (in_RSI == 1) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    pcVar2 = "all ";
    if (in_RSI == 2) {
      pcVar2 = "both ";
    }
    std::allocator<char>::allocator();
    bVar1 = true;
    std::__cxx11::string::string((string *)in_RDI,pcVar2,local_11);
  }
  if (bVar1) {
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  return in_RDI;
}

Assistant:

std::string bothOrAll( std::size_t count ) {
        return count == 1 ? std::string() :
               count == 2 ? "both " : "all " ;
    }